

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cc
# Opt level: O3

auto_ptr<avro::OutputStream> __thiscall
avro::fileOutputStream(avro *this,char *filename,size_t bufferSize)

{
  int iVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  void *pvVar4;
  Exception *this_00;
  int *piVar5;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *msg;
  char *local_120;
  put_holder<char,_std::char_traits<char>_> local_118;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  
  puVar2 = (undefined8 *)operator_new(0x10);
  *puVar2 = &PTR__FileBufferCopyOut_001ce958;
  iVar1 = open(filename,0x241,0x1a4);
  *(int *)(puVar2 + 1) = iVar1;
  if (-1 < iVar1) {
    puVar3 = (undefined8 *)operator_new(0x38);
    *puVar3 = &PTR__BufferCopyOutputStream_001cea40;
    puVar3[1] = bufferSize;
    pvVar4 = operator_new__(bufferSize);
    puVar3[2] = pvVar4;
    puVar3[3] = puVar2;
    puVar3[4] = pvVar4;
    puVar3[5] = bufferSize;
    puVar3[6] = 0;
    *(undefined8 **)this = puVar3;
    return (auto_ptr<avro::OutputStream>)(OutputStream *)this;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            (&local_100,"Cannot open file: %1%");
  piVar5 = __errno_location();
  local_120 = strerror(*piVar5);
  local_118.arg = &local_120;
  local_118.put_head = boost::io::detail::call_put_head<char,std::char_traits<char>,char*const>;
  local_118.put_last = boost::io::detail::call_put_last<char,std::char_traits<char>,char*const>;
  msg = boost::io::detail::
        feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                  (&local_100,&local_118);
  Exception::Exception(this_00,msg);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

auto_ptr<OutputStream> fileOutputStream(const char* filename,
    size_t bufferSize)
{
    auto_ptr<BufferCopyOut> out(new FileBufferCopyOut(filename));
    return auto_ptr<OutputStream>(new BufferCopyOutputStream(out, bufferSize));
}